

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soupfile.hh
# Opt level: O1

size_t __thiscall
helix::nasdaq::soupfile_session<helix::nasdaq::nordic_itch_handler>::process_packet
          (soupfile_session<helix::nasdaq::nordic_itch_handler> *this,packet_view *packet)

{
  int iVar1;
  size_type sVar2;
  size_t sVar3;
  runtime_error *this_00;
  string_view view;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  if ((process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&process_packet(helix::net::packet_view_const&)::
                                   terminator_abi_cxx11_), iVar1 != 0)) {
    process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_._M_dataplus._M_p =
         (pointer)&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_,
               "\r\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_);
  }
  local_28._M_str = packet->_buf;
  local_28._M_len = packet->_len;
  sVar2 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
          find_first_of(&local_28,
                        process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_.
                        _M_dataplus._M_p,0,
                        process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_.
                        _M_string_length);
  if (sVar2 == 0) {
    return 0;
  }
  if (sVar2 == 0xffffffffffffffff) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"packet is truncated");
  }
  else {
    sVar3 = nordic_itch_handler::process_packet(&this->_handler,packet);
    if (sVar3 <= sVar2) {
      return sVar2 + process_packet(helix::net::packet_view_const&)::terminator_abi_cxx11_.
                     _M_string_length;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"parsed message is larger than the framing");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t soupfile_session<Handler>::process_packet(const net::packet_view& packet)
{
    static std::string terminator = "\r\n";
    auto view = packet.as_string_view();
    auto terminator_start = view.find_first_of(terminator);
    if (terminator_start == std::experimental::string_view::npos) {
        throw std::runtime_error("packet is truncated");
    }
    if (!terminator_start) {
        return 0;
    }
    auto nr = _handler.process_packet(packet);
    if (nr > terminator_start) {
        throw std::runtime_error("parsed message is larger than the framing");
    }
    return terminator_start + terminator.size();
}